

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O2

bool __thiscall ELFIO::elfio::save(elfio *this,string *file_name)

{
  bool bVar1;
  ofstream stream;
  byte abStack_1f8 [480];
  
  std::ofstream::ofstream(&stream);
  std::ofstream::open((char *)&stream,(_Ios_Openmode)(file_name->_M_dataplus)._M_p);
  if ((abStack_1f8[*(long *)(_stream + -0x18)] & 5) == 0) {
    bVar1 = save(this,(ostream *)&stream);
  }
  else {
    bVar1 = false;
  }
  std::ofstream::~ofstream(&stream);
  return bVar1;
}

Assistant:

bool save( const std::string& file_name )
    {
        std::ofstream stream;
        stream.open( file_name.c_str(), std::ios::out | std::ios::binary );
        if ( !stream ) {
            return false;
        }

        return save( stream );
    }